

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_create_collation_v2
              (sqlite3 *db,char *zName,int enc,void *pCtx,
              _func_int_void_ptr_int_void_ptr_int_void_ptr *xCompare,_func_void_void_ptr *xDel)

{
  int iVar1;
  _func_void_void_ptr *in_RSI;
  _func_int_void_ptr_int_void_ptr_int_void_ptr *in_RDI;
  int rc;
  void *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffc8;
  
  sqlite3_mutex_enter((sqlite3_mutex *)0x14d96b);
  iVar1 = createCollation((sqlite3 *)pCtx,(char *)xCompare,xDel._7_1_,unaff_retaddr,in_RDI,in_RSI);
  iVar1 = sqlite3ApiExit((sqlite3 *)CONCAT44(iVar1,in_stack_ffffffffffffffc8),0);
  sqlite3_mutex_leave((sqlite3_mutex *)0x14d9b4);
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_create_collation_v2(
  sqlite3* db,
  const char *zName,
  int enc,
  void* pCtx,
  int(*xCompare)(void*,int,const void*,int,const void*),
  void(*xDel)(void*)
){
  int rc;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || zName==0 ) return SQLITE_MISUSE_BKPT;
#endif
  sqlite3_mutex_enter(db->mutex);
  assert( !db->mallocFailed );
  rc = createCollation(db, zName, (u8)enc, pCtx, xCompare, xDel);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}